

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

void stbtt_MakeGlyphBitmapSubpixelPrefilter
               (stbtt_fontinfo *info,uchar *output,int out_w,int out_h,int out_stride,float scale_x,
               float scale_y,float shift_x,float shift_y,int prefilter_x,int prefilter_y,
               float *sub_x,float *sub_y,int glyph)

{
  float fVar1;
  float fVar2;
  
  stbtt_MakeGlyphBitmapSubpixel
            (info,output,(out_w - prefilter_x) + 1,(out_h - prefilter_y) + 1,out_stride,scale_x,
             scale_y,shift_x,shift_y,glyph);
  if (1 < prefilter_x) {
    stbtt__h_prefilter(output,out_w,out_h,out_stride,prefilter_x);
  }
  if (1 < prefilter_y) {
    stbtt__v_prefilter(output,out_w,out_h,out_stride,prefilter_y);
  }
  fVar1 = 0.0;
  fVar2 = 0.0;
  if (prefilter_x != 0) {
    fVar2 = (float)(1 - prefilter_x) / ((float)prefilter_x + (float)prefilter_x);
  }
  *sub_x = fVar2;
  if (prefilter_y != 0) {
    fVar1 = (float)(1 - prefilter_y) / ((float)prefilter_y + (float)prefilter_y);
  }
  *sub_y = fVar1;
  return;
}

Assistant:

STBTT_DEF void stbtt_MakeGlyphBitmapSubpixelPrefilter(const stbtt_fontinfo *info, unsigned char *output, int out_w, int out_h, int out_stride, float scale_x, float scale_y, float shift_x, float shift_y, int prefilter_x, int prefilter_y, float *sub_x, float *sub_y, int glyph)
{
   stbtt_MakeGlyphBitmapSubpixel(info,
                                 output,
                                 out_w - (prefilter_x - 1),
                                 out_h - (prefilter_y - 1),
                                 out_stride,
                                 scale_x,
                                 scale_y,
                                 shift_x,
                                 shift_y,
                                 glyph);

   if (prefilter_x > 1)
      stbtt__h_prefilter(output, out_w, out_h, out_stride, prefilter_x);

   if (prefilter_y > 1)
      stbtt__v_prefilter(output, out_w, out_h, out_stride, prefilter_y);

   *sub_x = stbtt__oversample_shift(prefilter_x);
   *sub_y = stbtt__oversample_shift(prefilter_y);
}